

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectPoller.cpp
# Opt level: O3

void __thiscall sznet::net::SelectPoller::updateChannel(SelectPoller *this,Channel *channel)

{
  ChannelMap *this_00;
  _Rb_tree_header *p_Var1;
  EventLoop *this_01;
  char *pcVar2;
  iterator __position;
  Event_t EVar3;
  bool bVar4;
  LogStream *this_02;
  mapped_type *ppCVar5;
  long lVar6;
  pointer pEVar7;
  char **ppcVar8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  SourceFile file;
  Logger local_ff8;
  
  this_01 = (this->super_Poller).m_ownerLoop;
  bVar4 = EventLoop::isInLoopThread(this_01);
  if (!bVar4) {
    EventLoop::abortNotInLoopThread(this_01);
  }
  if (g_logLevel < 1) {
    file._8_8_ = 0x10;
    file.m_data = "SelectPoller.cpp";
    Logger::Logger(&local_ff8,file,0x70,TRACE,"updateChannel");
    if (5 < (uint)(((int)&local_ff8 + 0xfb0) - (int)local_ff8.m_impl.m_stream.m_buffer.m_cur)) {
      builtin_strncpy(local_ff8.m_impl.m_stream.m_buffer.m_cur,"fd = ",5);
      local_ff8.m_impl.m_stream.m_buffer.m_cur = local_ff8.m_impl.m_stream.m_buffer.m_cur + 5;
    }
    this_02 = LogStream::operator<<(&local_ff8.m_impl.m_stream,channel->m_fd);
    pcVar2 = (this_02->m_buffer).m_cur;
    ppcVar8 = &(this_02->m_buffer).m_cur;
    if (10 < (uint)((int)ppcVar8 - (int)pcVar2)) {
      builtin_strncpy(pcVar2," events = ",10);
      *ppcVar8 = *ppcVar8 + 10;
    }
    LogStream::operator<<(this_02,channel->m_events);
    Logger::~Logger(&local_ff8);
  }
  local_ff8.m_impl.m_time.m_microSecondsSinceEpoch._0_4_ = channel->m_fd;
  p_Var9 = (this->super_Poller).m_channels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  this_00 = &(this->super_Poller).m_channels;
  p_Var1 = &(this->super_Poller).m_channels._M_t._M_impl.super__Rb_tree_header;
  if (channel->m_index < 0) {
    p_Var10 = &p_Var1->_M_header;
    if (p_Var9 != (_Base_ptr)0x0) {
      do {
        if ((int)local_ff8.m_impl.m_time.m_microSecondsSinceEpoch <= (int)p_Var9[1]._M_color) {
          p_Var10 = p_Var9;
        }
        p_Var9 = (&p_Var9->_M_left)
                 [(int)p_Var9[1]._M_color < (int)local_ff8.m_impl.m_time.m_microSecondsSinceEpoch];
      } while (p_Var9 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var10 != p_Var1) &&
         ((int)p_Var10[1]._M_color <= (int)local_ff8.m_impl.m_time.m_microSecondsSinceEpoch)) {
        __assert_fail("m_channels.find(channel->fd()) == m_channels.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                      ,0x74,"virtual void sznet::net::SelectPoller::updateChannel(Channel *)");
      }
    }
    local_ff8.m_impl.m_time.m_microSecondsSinceEpoch._4_4_ = channel->m_events;
    __position._M_current =
         (this->m_pollfds).
         super__Vector_base<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_pollfds).
        super__Vector_base<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<sznet::net::Channel::Event_t,std::allocator<sznet::net::Channel::Event_t>>::
      _M_realloc_insert<sznet::net::Channel::Event_t_const&>
                ((vector<sznet::net::Channel::Event_t,std::allocator<sznet::net::Channel::Event_t>>
                  *)&this->m_pollfds,__position,(Event_t *)&local_ff8);
      pEVar7 = (this->m_pollfds).
               super__Vector_base<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      EVar3.ev = local_ff8.m_impl.m_time.m_microSecondsSinceEpoch._4_4_;
      EVar3.fd = (int)local_ff8.m_impl.m_time.m_microSecondsSinceEpoch;
      *__position._M_current = EVar3;
      pEVar7 = (this->m_pollfds).
               super__Vector_base<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
      (this->m_pollfds).
      super__Vector_base<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
      ._M_impl.super__Vector_impl_data._M_finish = pEVar7;
    }
    channel->m_index =
         (int)((ulong)((long)pEVar7 -
                      (long)(this->m_pollfds).
                            super__Vector_base<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
    ppCVar5 = std::
              map<int,_sznet::net::Channel_*,_std::less<int>,_std::allocator<std::pair<const_int,_sznet::net::Channel_*>_>_>
              ::operator[](this_00,(key_type *)&local_ff8);
    *ppCVar5 = channel;
    return;
  }
  p_Var10 = &p_Var1->_M_header;
  if (p_Var9 != (_Base_ptr)0x0) {
    do {
      if ((int)local_ff8.m_impl.m_time.m_microSecondsSinceEpoch <= (int)p_Var9[1]._M_color) {
        p_Var10 = p_Var9;
      }
      p_Var9 = (&p_Var9->_M_left)
               [(int)p_Var9[1]._M_color < (int)local_ff8.m_impl.m_time.m_microSecondsSinceEpoch];
    } while (p_Var9 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var10 != p_Var1) &&
       ((int)p_Var10[1]._M_color <= (int)local_ff8.m_impl.m_time.m_microSecondsSinceEpoch)) {
      ppCVar5 = std::
                map<int,_sznet::net::Channel_*,_std::less<int>,_std::allocator<std::pair<const_int,_sznet::net::Channel_*>_>_>
                ::operator[](this_00,(key_type *)&local_ff8);
      if (*ppCVar5 != channel) {
        __assert_fail("m_channels[channel->fd()] == channel",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                      ,0x82,"virtual void sznet::net::SelectPoller::updateChannel(Channel *)");
      }
      lVar6 = (long)channel->m_index;
      if ((-1 < lVar6) &&
         (pEVar7 = (this->m_pollfds).
                   super__Vector_base<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
                   ._M_impl.super__Vector_impl_data._M_start,
         channel->m_index <
         (int)((ulong)((long)(this->m_pollfds).
                             super__Vector_base<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar7) >> 3))) {
        if (pEVar7[lVar6].fd == channel->m_fd) {
          pEVar7[lVar6].ev = channel->m_events;
          return;
        }
        __assert_fail("event.fd == channel->fd()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                      ,0x86,"virtual void sznet::net::SelectPoller::updateChannel(Channel *)");
      }
      __assert_fail("0 <= idx && idx < static_cast<int>(m_pollfds.size())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                    ,0x84,"virtual void sznet::net::SelectPoller::updateChannel(Channel *)");
    }
  }
  __assert_fail("m_channels.find(channel->fd()) != m_channels.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                ,0x81,"virtual void sznet::net::SelectPoller::updateChannel(Channel *)");
}

Assistant:

void SelectPoller::updateChannel(Channel* channel)
{
	Poller::assertInLoopThread();
	LOG_TRACE << "fd = " << channel->fd() << " events = " << channel->events();
	// add
	if (channel->index() < 0)
	{
		assert(m_channels.find(channel->fd()) == m_channels.end());
		Channel::Event_t event;
		event.fd = channel->fd();
		event.ev = channel->events();
		m_pollfds.push_back(event);
		int idx = static_cast<int>(m_pollfds.size()) - 1;
		channel->set_index(idx);
		m_channels[event.fd] = channel;
	}
	// mod
	else
	{
		// channel事件有能为kNoneEvent
		assert(m_channels.find(channel->fd()) != m_channels.end());
		assert(m_channels[channel->fd()] == channel);
		int idx = channel->index();
		assert(0 <= idx && idx < static_cast<int>(m_pollfds.size()));
		Channel::Event_t& event = m_pollfds[idx];
		assert(event.fd == channel->fd());
		event.ev = channel->events();
	}
}